

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogicOperatorType.cpp
# Opt level: O1

string * __thiscall
IRT::ToString_abi_cxx11_(string *__return_storage_ptr__,IRT *this,LogicOperatorType type)

{
  string *psVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  char *pcVar3;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "LT";
    pcVar2 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "GT";
    pcVar2 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "EQ";
    pcVar2 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "NE";
    pcVar2 = "";
    break;
  default:
    psVar1 = (string *)__cxa_allocate_exception(0x20,this,CONCAT71(in_register_00000011,type));
    *(string **)psVar1 = psVar1 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar1,"unknown logic operator type","");
    __cxa_throw(psVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string IRT::ToString(IRT::LogicOperatorType type) {
  switch (type) {
    case LogicOperatorType::EQ:
      return "EQ";
    case LogicOperatorType::NE:
      return "NE";
    case LogicOperatorType::LT:
      return "LT";
    case LogicOperatorType::GT:
      return "GT";
  }
  throw std::string("unknown logic operator type");
}